

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

MacroActualArgumentListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroActualArgumentListSyntax,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,
          span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *args_1,Token *args_2)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  MacroActualArgumentListSyntax *this_00;
  pointer in_stack_ffffffffffffff78;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *in_stack_ffffffffffffff98;
  MacroActualArgumentListSyntax *in_stack_ffffffffffffffa0;
  Token in_stack_ffffffffffffffa8;
  Token in_stack_ffffffffffffffb8;
  
  this_00 = (MacroActualArgumentListSyntax *)
            allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80._M_extent_value,
                     (size_t)in_stack_ffffffffffffff78);
  elements._M_extent._M_extent_value = in_stack_ffffffffffffff80._M_extent_value;
  elements._M_ptr = in_stack_ffffffffffffff78;
  slang::syntax::SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>::SeparatedSyntaxList
            ((SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *)this_00,elements);
  slang::syntax::MacroActualArgumentListSyntax::MacroActualArgumentListSyntax
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffffa8);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }